

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_doc(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,size_t id)

{
  Tree *this_00;
  NodeType_e NVar1;
  code *pcVar2;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  NodeType_e NVar3;
  bool bVar4;
  error_flags eVar5;
  NodeData *pNVar6;
  size_t i;
  csubstr *pcVar7;
  NodeScalar *pNVar8;
  csubstr cVar9;
  char *pcStack_30;
  
  pNVar6 = Tree::_p(this->m_tree,id);
  if (((pNVar6->m_type).type & DOC) == NOTYPE) {
    eVar5 = get_error_flags();
    if ((eVar5 & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    pcStack_30 = cVar9.str;
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x58a3) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x58a3) << 0x40,8);
    loc.name.str = pcStack_30;
    loc.name.len = cVar9.len;
    error("check failed: m_tree->is_doc(id)",0x20,loc);
  }
  bVar4 = Tree::is_root(this->m_tree,id);
  if (!bVar4) {
    this_00 = this->m_tree;
    i = Tree::parent(this_00,id);
    pNVar6 = Tree::_p(this_00,i);
    if ((~(int)(pNVar6->m_type).type & 0x28U) != 0) {
      eVar5 = get_error_flags();
      if ((eVar5 & 1) != 0) {
        bVar4 = is_debugger_attached();
        if (bVar4) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      cVar9 = to_csubstr(
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                        );
      pcStack_30 = cVar9.str;
      loc_00.super_LineCol.col = 0;
      loc_00.super_LineCol.offset = SUB168(ZEXT816(0x58a6) << 0x40,0);
      loc_00.super_LineCol.line = SUB168(ZEXT816(0x58a6) << 0x40,8);
      loc_00.name.str = pcStack_30;
      loc_00.name.len = cVar9.len;
      error("check failed: m_tree->is_stream(m_tree->parent(id))",0x33,loc_00);
    }
    WriterOStream<std::__cxx11::stringstream>::_do_write<4ul>
              ((WriterOStream<std::__cxx11::stringstream> *)this,(char (*) [4])"---");
  }
  pNVar6 = Tree::_p(this->m_tree,id);
  NVar3 = (pNVar6->m_type).type;
  pNVar6 = Tree::_p(this->m_tree,id);
  NVar1 = (pNVar6->m_type).type;
  if ((NVar3 & VAL) == NOTYPE) {
    if ((NVar1 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar1 >> 0xb & 1) != 0) {
      bVar4 = Tree::is_root(this->m_tree,id);
      if (!bVar4) {
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,' ');
      }
      pcVar7 = Tree::val_tag(this->m_tree,id);
      _write_tag(this,*pcVar7);
    }
    pNVar6 = Tree::_p(this->m_tree,id);
    NVar1 = (pNVar6->m_type).type;
    if ((NVar1 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar1 >> 9 & 1) != 0) {
      bVar4 = Tree::is_root(this->m_tree,id);
      if (!bVar4) {
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,' ');
      }
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,'&');
      pcVar7 = Tree::val_anchor(this->m_tree,id);
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,*pcVar7);
    }
  }
  else {
    if ((NVar1 & VAL) == NOTYPE) {
      eVar5 = get_error_flags();
      if ((eVar5 & 1) != 0) {
        bVar4 = is_debugger_attached();
        if (bVar4) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      cVar9 = to_csubstr(
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                        );
      pcStack_30 = cVar9.str;
      loc_01.super_LineCol.col = 0;
      loc_01.super_LineCol.offset = SUB168(ZEXT816(0x58bb) << 0x40,0);
      loc_01.super_LineCol.line = SUB168(ZEXT816(0x58bb) << 0x40,8);
      loc_01.name.str = pcStack_30;
      loc_01.name.len = cVar9.len;
      error("check failed: m_tree->has_val(id)",0x21,loc_01);
    }
    pNVar6 = Tree::_p(this->m_tree,id);
    if (((pNVar6->m_type).type & KEY) != NOTYPE) {
      eVar5 = get_error_flags();
      if ((eVar5 & 1) != 0) {
        bVar4 = is_debugger_attached();
        if (bVar4) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
      }
      cVar9 = to_csubstr(
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                        );
      pcStack_30 = cVar9.str;
      loc_02.super_LineCol.col = 0;
      loc_02.super_LineCol.offset = SUB168(ZEXT816(0x58bc) << 0x40,0);
      loc_02.super_LineCol.line = SUB168(ZEXT816(0x58bc) << 0x40,8);
      loc_02.name.str = pcStack_30;
      loc_02.name.len = cVar9.len;
      error("check failed: !m_tree->has_key(id)",0x22,loc_02);
    }
    bVar4 = Tree::is_root(this->m_tree,id);
    if (!bVar4) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,' ');
    }
    pNVar8 = Tree::valsc(this->m_tree,id);
    pNVar6 = Tree::_p(this->m_tree,id);
    _write(this,(int)pNVar8,(void *)(ulong)((uint)(pNVar6->m_type).type & 0x5541281),0);
  }
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_do_write(&this->
               super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ,'\n');
  return;
}

Assistant:

void Emitter<Writer>::_write_doc(size_t id)
{
    RYML_ASSERT(m_tree->is_doc(id));
    if(!m_tree->is_root(id))
    {
        RYML_ASSERT(m_tree->is_stream(m_tree->parent(id)));
        this->Writer::_do_write("---");
    }
    if(!m_tree->has_val(id)) // this is more frequent
    {
        if(m_tree->has_val_tag(id))
        {
            if(!m_tree->is_root(id))
                this->Writer::_do_write(' ');
            _write_tag(m_tree->val_tag(id));
        }
        if(m_tree->has_val_anchor(id))
        {
            if(!m_tree->is_root(id))
                this->Writer::_do_write(' ');
            this->Writer::_do_write('&');
            this->Writer::_do_write(m_tree->val_anchor(id));
        }
    }
    else // docval
    {
        RYML_ASSERT(m_tree->has_val(id));
        RYML_ASSERT(!m_tree->has_key(id));
        if(!m_tree->is_root(id))
            this->Writer::_do_write(' ');
        _writev(id, 0);
    }
    this->Writer::_do_write('\n');
}